

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

int Prs_CreateBitSignal(Prs_Ntk_t *pNtk,int Sig)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  
  if (-1 < Sig) {
    uVar9 = (uint)Sig >> 2;
    uVar6 = 0xffffffff;
    if (1 < (Sig & 3U)) {
      if ((Sig & 3U) == 2) {
        pcVar7 = Abc_NamStr(pNtk->pFuns,uVar9);
        pcVar7 = strchr(pcVar7,0x27);
        if (pcVar7[1] != 'b') {
          __assert_fail("*pConst == \'b\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x679,"int Prs_CreateBitSignal(Prs_Ntk_t *, int)");
        }
        pcVar7 = pcVar7 + 1;
        bVar4 = true;
        bVar8 = false;
        while( true ) {
          pcVar7 = pcVar7 + 1;
          cVar1 = *pcVar7;
          if (cVar1 == '\0') break;
          if (cVar1 == '0') {
            bVar4 = false;
          }
          else if (cVar1 == '1') {
            bVar8 = true;
          }
        }
        uVar6 = 6;
        if (bVar8) {
          uVar6 = -(uint)!bVar4 | 10;
        }
      }
      else {
        iVar2 = (pNtk->vConcats).nSize;
        if (iVar2 <= (int)uVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar3 = (pNtk->vConcats).pArray;
        Prs_CatSignals_V_1 = piVar3[uVar9];
        if (iVar2 <= (int)(uVar9 + 1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        Prs_CatSignals_V_2 = piVar3 + (uVar9 + 1);
        uVar6 = 0xffffffff;
        if (0 < (int)Prs_CatSignals_V_1) {
          uVar10 = 0;
          do {
            uVar9 = Prs_CatSignals_V_2[uVar10];
            if ((int)uVar9 < 0) goto LAB_003e3578;
            if ((uVar9 & 3) != 0) {
              return -1;
            }
            uVar5 = uVar9 >> 2;
            if ((uVar6 != 0xffffffff) && (uVar5 = uVar6, uVar6 != uVar9 >> 2)) {
              return -1;
            }
            uVar6 = uVar5;
            uVar10 = uVar10 + 1;
          } while (Prs_CatSignals_V_1 != uVar10);
        }
        if ((int)uVar6 < 0) {
          __assert_fail("SigOne >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x692,"int Prs_CreateBitSignal(Prs_Ntk_t *, int)");
        }
        uVar6 = uVar6 << 2;
      }
    }
    return uVar6;
  }
LAB_003e3578:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x13d,"int Abc_Lit2Var2(int)");
}

Assistant:

int Prs_CreateBitSignal( Prs_Ntk_t * pNtk, int Sig )
{
    Vec_Int_t * vSigs;
    int i, SigTemp, SigOne = -1, Value = Abc_Lit2Var2( Sig );
    Prs_ManType_t Type = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    if ( Type == CBA_PRS_NAME || Type == CBA_PRS_SLICE )
        return -1;
    if ( Type == CBA_PRS_CONST )
    {
        int fOnly0 = 1, fOnly1 = 1;
        char * pConst = Prs_NtkConst(pNtk, Value);
        pConst = strchr( pConst, '\'' ) + 1;
        assert( *pConst == 'b' );
        while ( *++pConst )
            if ( *pConst == '0' )
                fOnly1 = 0;
            else if ( *pConst == '1' )
                fOnly0 = 0;
        if ( fOnly0 )
            return Abc_Var2Lit2( 1, CBA_PRS_CONST ); // const0
        if ( fOnly1 )
            return Abc_Var2Lit2( 2, CBA_PRS_CONST ); // const1
        return -1;
    }
    assert( Type == CBA_PRS_CONCAT );
    vSigs = Prs_CatSignals( pNtk, Value );
    Vec_IntForEachEntry( vSigs, SigTemp, i )
    {
        Value = Abc_Lit2Var2( SigTemp );
        Type = (Prs_ManType_t)Abc_Lit2Att2( SigTemp );
        if ( Type != CBA_PRS_NAME )
            return -1;
        if ( SigOne == -1 )
            SigOne = Value;
        else if ( SigOne != Value )
            return -1;
    }
    assert( SigOne >= 0 );
    return Abc_Var2Lit2( SigOne, CBA_PRS_NAME );
}